

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O0

char * dpfb::str::format_abi_cxx11_(char *fmt,...)

{
  char in_AL;
  char *__s;
  size_t __maxlen;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_128 [16];
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined4 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined1 local_6d;
  allocator local_5d;
  int local_5c;
  undefined8 uStack_58;
  int size;
  va_list args2;
  undefined4 uStack_38;
  undefined4 uStack_34;
  va_list args1;
  char *fmt_local;
  string *result;
  
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Da;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  args2[0].overflow_arg_area = local_128;
  args2[0]._0_8_ = &stack0x00000008;
  uStack_34 = 0x30;
  uStack_38 = 0x10;
  uStack_58 = 0x3000000010;
  local_118 = in_RDX;
  local_110 = in_RCX;
  local_108 = in_R8;
  local_100 = in_R9;
  args1[0]._0_8_ = args2[0]._0_8_;
  args1[0].overflow_arg_area = args2[0].overflow_arg_area;
  local_5c = vsnprintf((char *)0x0,0,in_RSI,&uStack_38);
  if (local_5c < 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)fmt,"",&local_5d);
    std::allocator<char>::~allocator((allocator<char> *)&local_5d);
  }
  else {
    local_6d = 0;
    std::__cxx11::string::string((string *)fmt);
    std::__cxx11::string::resize((ulong)fmt);
    __s = (char *)std::__cxx11::string::operator[]((ulong)fmt);
    __maxlen = std::__cxx11::string::length();
    vsnprintf(__s,__maxlen,in_RSI,&stack0xffffffffffffffa8);
    std::__cxx11::string::pop_back();
  }
  return fmt;
}

Assistant:

std::string format(const char* fmt, ...)
{
    va_list args1;
    va_start(args1, fmt);
    va_list args2;
    va_copy(args2, args1);

    const auto size = std::vsnprintf(nullptr, 0, fmt, args1);
    va_end(args1);
    if (size <= 0) {
        va_end(args2);
        return "";
    }

    std::string result;
    result.resize(size + 1);
    std::vsnprintf(&result[0], result.length(), fmt, args2);
    va_end(args2);

    result.pop_back();
    return result;
}